

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O0

int registerTypeName(lua_State *L)

{
  dll_lua_pushstring p_Var1;
  undefined8 uVar2;
  bool bVar3;
  EmmyFacade *this;
  char *pcVar4;
  allocator local_71;
  string local_70;
  byte local_4d;
  bool suc;
  char *local_40;
  char *typeName;
  string err;
  lua_State *L_local;
  
  err.field_2._8_8_ = L;
  (*luaL_checklstring)(L,1,(size_t *)0x0);
  std::__cxx11::string::string((string *)&typeName);
  local_40 = (*lua_tolstring)((lua_State *)err.field_2._8_8_,1,(size_t *)0x0);
  this = EmmyFacade::Get();
  uVar2 = err.field_2._8_8_;
  pcVar4 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,pcVar4,&local_71);
  bVar3 = EmmyFacade::RegisterTypeName(this,(lua_State *)uVar2,&local_70,(string *)&typeName);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_4d = bVar3;
  (*lua_pushboolean)((lua_State *)err.field_2._8_8_,(uint)bVar3);
  uVar2 = err.field_2._8_8_;
  p_Var1 = lua_pushstring;
  if ((local_4d & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    (*p_Var1)((lua_State *)uVar2,pcVar4);
    L_local._4_4_ = 2;
  }
  else {
    L_local._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&typeName);
  return L_local._4_4_;
}

Assistant:

int registerTypeName(lua_State* L)
{
	luaL_checkstring(L, 1);
	std::string err;
	const auto typeName = lua_tostring(L, 1);
	const auto suc = EmmyFacade::Get().RegisterTypeName(L, typeName, err);
	lua_pushboolean(L, suc);
	if (suc) return 1;
	lua_pushstring(L, err.c_str());
	return 2;
}